

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlRegisterInputCallbacks
              (xmlInputMatchCallback matchFunc,xmlInputOpenCallback openFunc,
              xmlInputReadCallback readFunc,xmlInputCloseCallback closeFunc)

{
  xmlInputCloseCallback closeFunc_local;
  xmlInputReadCallback readFunc_local;
  xmlInputOpenCallback openFunc_local;
  xmlInputMatchCallback matchFunc_local;
  
  xmlInitParser();
  if (xmlInputCallbackNr < 10) {
    xmlInputCallbackTable[xmlInputCallbackNr].matchcallback = matchFunc;
    xmlInputCallbackTable[xmlInputCallbackNr].opencallback = openFunc;
    xmlInputCallbackTable[xmlInputCallbackNr].readcallback = readFunc;
    xmlInputCallbackTable[xmlInputCallbackNr].closecallback = closeFunc;
    matchFunc_local._4_4_ = xmlInputCallbackNr;
    xmlInputCallbackNr = xmlInputCallbackNr + 1;
  }
  else {
    matchFunc_local._4_4_ = -1;
  }
  return matchFunc_local._4_4_;
}

Assistant:

int
xmlRegisterInputCallbacks(xmlInputMatchCallback matchFunc,
	xmlInputOpenCallback openFunc, xmlInputReadCallback readFunc,
	xmlInputCloseCallback closeFunc) {
    xmlInitParser();

    if (xmlInputCallbackNr >= MAX_INPUT_CALLBACK) {
	return(-1);
    }
    xmlInputCallbackTable[xmlInputCallbackNr].matchcallback = matchFunc;
    xmlInputCallbackTable[xmlInputCallbackNr].opencallback = openFunc;
    xmlInputCallbackTable[xmlInputCallbackNr].readcallback = readFunc;
    xmlInputCallbackTable[xmlInputCallbackNr].closecallback = closeFunc;
    return(xmlInputCallbackNr++);
}